

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O1

pair<long_*,_long_*> __thiscall memt::Arena::allocArrayNoCon<long>(Arena *this,size_t elementCount)

{
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_t needed;
  pair<long_*,_long_*> pVar5;
  
  if (elementCount >> 0x3d == 0) {
    needed = elementCount * 8;
    pcVar1 = (this->_blocks)._block._position;
    pcVar2 = (this->_blocks)._block._end;
    if (((ulong)((long)pcVar2 - (long)pcVar1) <= elementCount * 8 - 1) &&
       ((elementCount != 0 || (needed = 1, pcVar2 == pcVar1)))) {
      growCapacity(this,needed);
    }
    plVar3 = (long *)(this->_blocks)._block._position;
    (this->_blocks)._block._position = (char *)((needed + 7 & 0xfffffffffffffff8) + (long)plVar3);
    pVar5.second = plVar3 + elementCount;
    pVar5.first = plVar3;
    return pVar5;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = dup2;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

std::pair<T*, T*> Arena::allocArrayNoCon(size_t elementCount) {
    if (elementCount > static_cast<size_t>(-1) / sizeof(T))
      throw std::bad_alloc();
    const size_t size = elementCount * sizeof(T);
    MEMT_ASSERT(size / sizeof(T) == elementCount);
    char* buffer = static_cast<char*>(alloc(size));
    T* array = reinterpret_cast<T*>(buffer);
    T* arrayEnd = reinterpret_cast<T*>(buffer + size);
    return std::make_pair(array, arrayEnd);
  }